

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::FreeWallyBuffer(void *source)

{
  CfdException *this;
  allocator local_a9;
  string local_a8;
  CfdSourceLocation local_88;
  undefined1 local_70 [8];
  wally_operations ops;
  int ret;
  wally_free_t free_func;
  void *source_local;
  
  memset(local_70,0,0x50);
  local_70 = (undefined1  [8])0x50;
  ops.reserved_4._4_4_ = wally_get_operations((wally_operations *)local_70);
  if (ops.reserved_4._4_4_ == 0) {
    (*ops.malloc_fn)((size_t)source);
    return;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x1b3;
  local_88.funcname = "FreeWallyBuffer";
  logger::warn<int&>(&local_88,"wally_get_operations NG[{}]",(int *)((long)&ops.reserved_4 + 4));
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_a8,"OperationFunctions get error.",&local_a9);
  CfdException::CfdException(this,kCfdInternalError,&local_a8);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void FreeWallyBuffer(void *source) {
  wally_free_t free_func = nullptr;

  int ret;
  if (free_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    free_func = ops.free_fn;
  }
  free_func(source);
}